

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O0

void __thiscall
icu_63::number::FormattedNumber::getDecimalQuantity
          (FormattedNumber *this,DecimalQuantity *output,UErrorCode *status)

{
  UBool UVar1;
  UErrorCode *status_local;
  DecimalQuantity *output_local;
  FormattedNumber *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (this->fResults == (UFormattedNumberData *)0x0) {
      *status = this->fErrorCode;
    }
    else {
      impl::DecimalQuantity::operator=(output,&this->fResults->quantity);
    }
  }
  return;
}

Assistant:

void FormattedNumber::getDecimalQuantity(DecimalQuantity& output, UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return;
    }
    if (fResults == nullptr) {
        status = fErrorCode;
        return;
    }
    output = fResults->quantity;
}